

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DisableForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableForkStatementSyntax,slang::syntax::DisableForkStatementSyntax_const&>
          (BumpAllocator *this,DisableForkStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  DisableForkStatementSyntax *pDVar18;
  
  pDVar18 = (DisableForkStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableForkStatementSyntax *)this->endPtr < pDVar18 + 1) {
    pDVar18 = (DisableForkStatementSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pDVar18 + 1);
  }
  (pDVar18->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pDVar18->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar18->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pDVar18->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar18->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar6;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar18->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar18->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar18->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005dac60;
  uVar7 = (args->disable).field_0x2;
  NVar8.raw = (args->disable).numFlags.raw;
  uVar9 = (args->disable).rawLen;
  pIVar3 = (args->disable).info;
  TVar10 = (args->fork).kind;
  uVar11 = (args->fork).field_0x2;
  NVar12.raw = (args->fork).numFlags.raw;
  uVar13 = (args->fork).rawLen;
  pIVar4 = (args->fork).info;
  TVar14 = (args->semi).kind;
  uVar15 = (args->semi).field_0x2;
  NVar16.raw = (args->semi).numFlags.raw;
  uVar17 = (args->semi).rawLen;
  pIVar5 = (args->semi).info;
  (pDVar18->disable).kind = (args->disable).kind;
  (pDVar18->disable).field_0x2 = uVar7;
  (pDVar18->disable).numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar18->disable).rawLen = uVar9;
  (pDVar18->disable).info = pIVar3;
  (pDVar18->fork).kind = TVar10;
  (pDVar18->fork).field_0x2 = uVar11;
  (pDVar18->fork).numFlags = (NumericTokenFlags)NVar12.raw;
  (pDVar18->fork).rawLen = uVar13;
  (pDVar18->fork).info = pIVar4;
  (pDVar18->semi).kind = TVar14;
  (pDVar18->semi).field_0x2 = uVar15;
  (pDVar18->semi).numFlags = (NumericTokenFlags)NVar16.raw;
  (pDVar18->semi).rawLen = uVar17;
  (pDVar18->semi).info = pIVar5;
  return pDVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }